

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTable.cpp
# Opt level: O1

ByteArray * __thiscall
EncodingTable::encodeString
          (ByteArray *__return_storage_ptr__,EncodingTable *this,string *str,bool writeTermination)

{
  pointer pTVar1;
  bool bVar2;
  undefined7 in_register_00000009;
  ulong uVar3;
  ulong uVar4;
  Trie *this_00;
  size_t index;
  ByteArray result;
  byte local_71;
  ByteArray *local_70;
  byte local_68;
  undefined7 uStack_67;
  undefined4 local_5c;
  Trie *local_58;
  string *local_50;
  ByteArray local_48;
  
  local_5c = (undefined4)CONCAT71(in_register_00000009,writeTermination);
  local_70 = __return_storage_ptr__;
  ByteArray::ByteArray(&local_48);
  this_00 = &this->lookup;
  uVar3 = 0;
  local_58 = this_00;
  local_50 = str;
  while (uVar3 < str->_M_string_length) {
    bVar2 = Trie::findLongestPrefix(this_00,(str->_M_dataplus)._M_p + uVar3,(size_t *)&local_68);
    if (bVar2) {
      pTVar1 = (this->entries).
               super__Vector_base<EncodingTable::TableEntry,_std::allocator<EncodingTable::TableEntry>_>
               ._M_impl.super__Vector_impl_data._M_start + CONCAT71(uStack_67,local_68);
      if (pTVar1->hexLen != 0) {
        uVar4 = 0;
        do {
          local_71 = (this->hexData).data_[uVar4 + pTVar1->hexPos];
          ByteArray::append(&local_48,&local_71,1);
          uVar4 = uVar4 + 1;
        } while (uVar4 < pTVar1->hexLen);
      }
      uVar3 = uVar3 + pTVar1->valueLen;
      this_00 = local_58;
      str = local_50;
    }
    else {
      ByteArray::ByteArray(local_70);
    }
    if (!bVar2) goto LAB_0014fd8d;
  }
  if (((char)local_5c != '\0') && ((this->terminationEntry).hexLen != 0)) {
    uVar3 = 0;
    do {
      local_68 = (this->hexData).data_[uVar3 + (this->terminationEntry).hexPos];
      ByteArray::append(&local_48,&local_68,1);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (this->terminationEntry).hexLen);
  }
  ByteArray::ByteArray(local_70,&local_48);
LAB_0014fd8d:
  ByteArray::~ByteArray(&local_48);
  return local_70;
}

Assistant:

ByteArray EncodingTable::encodeString(const std::string& str, bool writeTermination)
{
	ByteArray result;

	size_t pos = 0;
	while (pos < str.size())
	{
		size_t index;
		if (!lookup.findLongestPrefix(str.c_str()+pos,index))
		{
			// error
			return ByteArray();
		}

		TableEntry& entry = entries[index];
		for (size_t i = 0; i < entry.hexLen; i++)
		{
			result.appendByte(hexData[entry.hexPos+i]);
		}

		pos += entry.valueLen;
	}

	if (writeTermination)
	{
		TableEntry& entry = terminationEntry;
		for (size_t i = 0; i < entry.hexLen; i++)
		{
			result.appendByte(hexData[entry.hexPos+i]);
		}
	}

	return result;
}